

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

QArrayDataPointer<QNetworkCookie> * __thiscall
QArrayDataPointer<QNetworkCookie>::operator=
          (QArrayDataPointer<QNetworkCookie> *this,QArrayDataPointer<QNetworkCookie> *other)

{
  Data *pDVar1;
  QNetworkCookie *pQVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<QNetworkCookie> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = other->d;
  pQVar2 = other->ptr;
  qVar3 = other->size;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_28.d = this->d;
  local_28.ptr = this->ptr;
  this->d = pDVar1;
  this->ptr = pQVar2;
  local_28.size = this->size;
  this->size = qVar3;
  ~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QArrayDataPointer &operator=(const QArrayDataPointer &other) noexcept
    {
        QArrayDataPointer tmp(other);
        this->swap(tmp);
        return *this;
    }